

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTD_ldm_fillHashTable(ldmState_t *ldmState,BYTE *ip,BYTE *iend,ldmParams_t *params)

{
  BYTE *pBVar1;
  uint uVar2;
  bool bVar3;
  BYTE *pBVar4;
  BYTE *ptr;
  xxh_u64 xVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  size_t *splits;
  uint numSplits;
  ldmRollingHashState_t hashState;
  uint local_a0;
  uint local_9c;
  ldmState_t *local_98;
  ulong local_90;
  BYTE *local_88;
  size_t local_80;
  ldmParams_t *local_78;
  BYTE *local_70;
  ulong local_68;
  size_t *local_60;
  BYTE *local_58;
  ulong local_50;
  BYTE *local_48;
  ldmRollingHashState_t local_40;
  
  uVar2 = params->minMatchLength;
  local_58 = (ldmState->window).base;
  uVar12 = 0x40;
  if (uVar2 < 0x40) {
    uVar12 = uVar2;
  }
  bVar6 = (byte)params->hashRateLog;
  bVar7 = 0;
  if (params->hashRateLog - 1 < uVar12) {
    bVar7 = (char)uVar12 - bVar6;
  }
  local_40.stopMask = ~(-1L << (bVar6 & 0x3f)) << (bVar7 & 0x3f);
  local_40.rolling = 0xffffffff;
  if (ip < iend) {
    splits = ldmState->splitIndices;
    local_68 = (ulong)uVar2;
    local_48 = ip + local_68;
    local_90 = -local_68;
    local_9c = ~(-1 << ((char)params->hashLog - (char)params->bucketSizeLog & 0x1fU));
    local_98 = ldmState;
    local_88 = iend;
    local_78 = params;
    local_60 = splits;
    do {
      local_a0 = 0;
      local_80 = ZSTD_ldm_gear_feed(&local_40,ip,(long)local_88 - (long)ip,splits,&local_a0);
      uVar9 = (ulong)local_a0;
      if (uVar9 != 0) {
        uVar11 = 0;
        local_70 = ip;
        local_50 = uVar9;
        do {
          pBVar4 = ip + splits[uVar11];
          if (local_48 <= pBVar4) {
            pBVar1 = pBVar4 + local_90;
            lVar15 = 0x27d4eb2f165667c5;
            uVar9 = local_90;
            ptr = pBVar1;
            if (0x1f < uVar2) {
              lVar15 = 0x60ea27eeadc0b5d6;
              uVar18 = 0xc2b2ae3d27d4eb4f;
              uVar8 = 0;
              uVar17 = 0x61c8864e7a143579;
              do {
                uVar13 = *(long *)(pBVar4 + uVar9) * -0x3d4d51c2d82b14b1 + lVar15;
                uVar14 = uVar13 * 0x80000000 | uVar13 >> 0x21;
                lVar15 = uVar14 * -0x61c8864e7a143579;
                uVar18 = *(long *)(pBVar4 + uVar9 + 8) * -0x3d4d51c2d82b14b1 + uVar18;
                uVar10 = uVar18 * 0x80000000 | uVar18 >> 0x21;
                uVar8 = *(long *)(pBVar4 + uVar9 + 0x10) * -0x3d4d51c2d82b14b1 + uVar8;
                uVar13 = uVar8 * 0x80000000 | uVar8 >> 0x21;
                uVar18 = uVar10 * -0x61c8864e7a143579;
                uVar8 = uVar13 * -0x61c8864e7a143579;
                uVar17 = *(long *)(pBVar4 + uVar9 + 0x18) * -0x3d4d51c2d82b14b1 + uVar17;
                uVar16 = uVar17 * 0x80000000 | uVar17 >> 0x21;
                uVar17 = uVar16 * -0x61c8864e7a143579;
                uVar19 = uVar9 + 0x20;
                bVar3 = (long)uVar9 < -0x3f;
                uVar9 = uVar19;
              } while (bVar3);
              ptr = pBVar4 + uVar19;
              uVar9 = ((uVar13 * -0x784349ab80000000 | uVar13 * -0x210ca4fef0869357 >> 0x21) *
                       -0x61c8864e7a143579 ^
                      ((uVar10 * -0x784349ab80000000 | uVar10 * -0x210ca4fef0869357 >> 0x21) *
                       -0x61c8864e7a143579 ^
                      ((uVar14 * -0x784349ab80000000 | uVar14 * -0x210ca4fef0869357 >> 0x21) *
                       -0x61c8864e7a143579 ^
                      (uVar16 * -0x1939e850d5e40000 | uVar17 >> 0x2e) +
                      (uVar13 * 0x779b185ebca87000 | uVar8 >> 0x34) +
                      (uVar10 * 0x1bbcd8c2f5e54380 | uVar18 >> 0x39) +
                      (uVar14 * 0x3c6ef3630bd7950e | (ulong)(lVar15 < 0))) * -0x61c8864e7a143579 +
                      0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) *
                      -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
              lVar15 = ((uVar16 * -0x784349ab80000000 | uVar16 * -0x210ca4fef0869357 >> 0x21) *
                        -0x61c8864e7a143579 ^ uVar9) * -0x61c8864e7a143579 + -0x7a1435883d4d519d;
              ip = local_70;
              params = local_78;
            }
            xVar5 = XXH64_finalize(lVar15 + local_68,ptr,local_68,(XXH_alignment)uVar9);
            uVar9 = (ulong)((uint)xVar5 & local_9c);
            bVar7 = (byte)params->bucketSizeLog;
            pBVar4 = local_98->bucketOffsets;
            bVar6 = pBVar4[uVar9];
            local_98->hashTable[(uVar9 << (bVar7 & 0x3f)) + (ulong)bVar6] =
                 (ldmEntry_t)
                 ((ulong)(uint)((int)pBVar1 - (int)local_58) | xVar5 & 0xffffffff00000000);
            pBVar4[uVar9] = ~(byte)(-1 << (bVar7 & 0x1f)) & bVar6 + 1;
            uVar9 = local_50;
            splits = local_60;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar9);
      }
      ip = ip + local_80;
    } while (ip < local_88);
  }
  return;
}

Assistant:

void ZSTD_ldm_fillHashTable(
            ldmState_t* ldmState, const BYTE* ip,
            const BYTE* iend, ldmParams_t const* params)
{
    U32 const minMatchLength = params->minMatchLength;
    U32 const hBits = params->hashLog - params->bucketSizeLog;
    BYTE const* const base = ldmState->window.base;
    BYTE const* const istart = ip;
    ldmRollingHashState_t hashState;
    size_t* const splits = ldmState->splitIndices;
    unsigned numSplits;

    DEBUGLOG(5, "ZSTD_ldm_fillHashTable");

    ZSTD_ldm_gear_init(&hashState, params);
    while (ip < iend) {
        size_t hashed;
        unsigned n;

        numSplits = 0;
        hashed = ZSTD_ldm_gear_feed(&hashState, ip, iend - ip, splits, &numSplits);

        for (n = 0; n < numSplits; n++) {
            if (ip + splits[n] >= istart + minMatchLength) {
                BYTE const* const split = ip + splits[n] - minMatchLength;
                U64 const xxhash = XXH64(split, minMatchLength, 0);
                U32 const hash = (U32)(xxhash & (((U32)1 << hBits) - 1));
                ldmEntry_t entry;

                entry.offset = (U32)(split - base);
                entry.checksum = (U32)(xxhash >> 32);
                ZSTD_ldm_insertEntry(ldmState, hash, entry, *params);
            }
        }

        ip += hashed;
    }
}